

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

void __thiscall QAccessibleMenuItem::doAction(QAccessibleMenuItem *this,QString *actionName)

{
  bool bVar1;
  ulong uVar2;
  QMenuBar *pQVar3;
  QMenu *pQVar4;
  QAction *in_RSI;
  QMenu *menu;
  QMenuBar *bar;
  QString *in_stack_ffffffffffffffc8;
  QAction *this_00;
  
  uVar2 = QAction::isEnabled();
  if ((uVar2 & 1) != 0) {
    this_00 = in_RSI;
    QAccessibleActionInterface::pressAction();
    bVar1 = ::operator==((QString *)this_00,in_stack_ffffffffffffffc8);
    if (bVar1) {
      QAction::trigger((QAction *)0x7dc04e);
    }
    else {
      QAccessibleActionInterface::showMenuAction();
      bVar1 = ::operator==((QString *)this_00,(QString *)in_RSI);
      if (bVar1) {
        owner((QAccessibleMenuItem *)0x7dc080);
        pQVar3 = qobject_cast<QMenuBar*>((QObject *)0x7dc088);
        if (pQVar3 == (QMenuBar *)0x0) {
          owner((QAccessibleMenuItem *)0x7dc0fc);
          pQVar4 = qobject_cast<QMenu*>((QObject *)0x7dc104);
          if (pQVar4 != (QMenu *)0x0) {
            pQVar4 = QAction::menu<QMenu*>((QAction *)0x7dc11f);
            if (pQVar4 != (QMenu *)0x0) {
              QAction::menu<QMenu*>((QAction *)0x7dc133);
              bVar1 = QWidget::isVisible((QWidget *)0x7dc13b);
              if (bVar1) {
                QAction::menu<QMenu*>((QAction *)0x7dc14f);
                QWidget::hide((QWidget *)0x7dc157);
                return;
              }
            }
            QMenu::setActiveAction((QMenu *)this_00,in_RSI);
          }
        }
        else {
          pQVar4 = QAction::menu<QMenu*>((QAction *)0x7dc0a3);
          if (pQVar4 != (QMenu *)0x0) {
            QAction::menu<QMenu*>((QAction *)0x7dc0b7);
            bVar1 = QWidget::isVisible((QWidget *)0x7dc0bf);
            if (bVar1) {
              QAction::menu<QMenu*>((QAction *)0x7dc0d3);
              QWidget::hide((QWidget *)0x7dc0db);
              return;
            }
          }
          QMenuBar::setActiveAction((QMenuBar *)this_00,in_RSI);
        }
      }
    }
  }
  return;
}

Assistant:

void QAccessibleMenuItem::doAction(const QString &actionName)
{
    if (!m_action->isEnabled())
        return;

    if (actionName == pressAction()) {
        m_action->trigger();
    } else if (actionName == showMenuAction()) {
#if QT_CONFIG(menubar)
        if (QMenuBar *bar = qobject_cast<QMenuBar*>(owner())) {
            if (m_action->menu() && m_action->menu()->isVisible()) {
                m_action->menu()->hide();
            } else {
                bar->setActiveAction(m_action);
            }
        } else
#endif
          if (QMenu *menu = qobject_cast<QMenu*>(owner())){
            if (m_action->menu() && m_action->menu()->isVisible()) {
                m_action->menu()->hide();
            } else {
                menu->setActiveAction(m_action);
            }
        }
    }
}